

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

void target_set_location(wchar_t y,wchar_t x)

{
  loc_conflict grid_00;
  loc grid;
  wchar_t x_local;
  wchar_t y_local;
  
  grid_00 = (loc_conflict)loc(x,y);
  target_set = square_in_bounds_fully((chunk *)cave,grid_00);
  target.grid = (loc)grid_00;
  if (!target_set) {
    target.grid.x = 0;
    target.grid.y = 0;
  }
  target.midx = 0;
  return;
}

Assistant:

void target_set_location(int y, int x)
{
	struct loc grid = loc(x, y);

	/* Legal target */
	if (square_in_bounds_fully(cave, grid)) {
		/* Save target info */
		target_set = true;
		target.midx = 0;
		target.grid = grid;
		return;
	}

	/* Reset target info */
	target_set = false;
	target.midx = 0;
	target.grid.y = 0;
	target.grid.x = 0;
}